

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::PReLU_x86_avx512::forward_inplace(PReLU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  undefined4 uVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  uint *puVar5;
  undefined4 *puVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  byte bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined8 uVar23;
  undefined8 uVar24;
  int iVar25;
  float *ptr;
  uint uVar26;
  undefined1 (*pauVar27) [64];
  uint uVar28;
  int iVar29;
  undefined1 (*pauVar30) [64];
  uint uVar31;
  undefined1 (*pauVar32) [32];
  undefined1 (*pauVar33) [16];
  ulong uVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  uint uVar38;
  ulong uVar39;
  ushort uVar40;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  
  iVar25 = bottom_top_blob->elempack;
  iVar29 = bottom_top_blob->dims;
  iVar35 = bottom_top_blob->w;
  uVar31 = bottom_top_blob->h;
  if (iVar29 == 3) {
    uVar26 = bottom_top_blob->c;
    if (0 < (int)uVar26) {
      uVar31 = iVar35 * iVar25 * uVar31;
      pp_Var3 = this->_vptr_PReLU_x86_avx512;
      uVar34 = 0;
      auVar44 = ZEXT864(0);
      auVar41 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        puVar6 = *(undefined4 **)(&this->field_0xd8 + (long)pp_Var3[-3]);
        if (*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) < 2) {
          uVar2 = *puVar6;
          auVar51._4_4_ = uVar2;
          auVar51._0_4_ = uVar2;
          auVar51._8_4_ = uVar2;
          auVar51._12_4_ = uVar2;
          auVar50 = auVar51;
LAB_00337209:
          auVar45 = ZEXT3264(CONCAT1616(auVar51,auVar51));
LAB_0033720f:
          auVar48 = auVar50;
          auVar53 = auVar45._0_32_;
          auVar45 = vinsertf64x4_avx512f(auVar45,auVar53,1);
        }
        else {
          uVar38 = puVar6[uVar34];
          auVar48 = ZEXT416(uVar38);
          if (iVar25 == 4) {
            auVar51 = *(undefined1 (*) [16])(puVar6 + uVar34 * 4);
            auVar50 = ZEXT416(uVar38);
            goto LAB_00337209;
          }
          auVar51._4_4_ = uVar38;
          auVar51._0_4_ = uVar38;
          auVar51._8_4_ = uVar38;
          auVar51._12_4_ = uVar38;
          auVar50 = ZEXT416(uVar38);
          if (iVar25 == 8) {
            auVar45 = ZEXT3264(*(undefined1 (*) [32])(puVar6 + uVar34 * 8));
            goto LAB_0033720f;
          }
          auVar53._4_4_ = uVar38;
          auVar53._0_4_ = uVar38;
          auVar53._8_4_ = uVar38;
          auVar53._12_4_ = uVar38;
          auVar53._16_4_ = uVar38;
          auVar53._20_4_ = uVar38;
          auVar53._24_4_ = uVar38;
          auVar53._28_4_ = uVar38;
          auVar45 = ZEXT3264(auVar53);
          if (iVar25 != 0x10) goto LAB_0033720f;
          auVar45 = *(undefined1 (*) [64])(puVar6 + uVar34 * 0x10);
        }
        pauVar27 = (undefined1 (*) [64])
                   (bottom_top_blob->cstep * uVar34 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar38 = 0;
        if (0xf < (int)uVar31) {
          iVar29 = 0xf;
          do {
            auVar46 = vmaxps_avx512f(*pauVar27,auVar44);
            auVar47 = vminps_avx512f(*pauVar27,auVar44);
            auVar46 = vfmadd213ps_avx512f(auVar47,auVar45,auVar46);
            *pauVar27 = auVar46;
            pauVar27 = pauVar27 + 1;
            iVar29 = iVar29 + 0x10;
            uVar38 = uVar31 & 0xfffffff0;
          } while (iVar29 < (int)uVar31);
        }
        uVar28 = uVar38 | 7;
        while ((int)uVar28 < (int)uVar31) {
          auVar52 = vmaxps_avx(*(undefined1 (*) [32])*pauVar27,ZEXT832(0));
          auVar49 = vminps_avx(*(undefined1 (*) [32])*pauVar27,ZEXT832(0));
          auVar50 = vfmadd213ps_fma(auVar49,auVar53,auVar52);
          *(undefined1 (*) [32])*pauVar27 = ZEXT1632(auVar50);
          pauVar27 = (undefined1 (*) [64])(*pauVar27 + 0x20);
          uVar28 = uVar38 + 0xf;
          uVar38 = uVar38 + 8;
        }
        uVar28 = uVar38 | 3;
        while ((int)uVar28 < (int)uVar31) {
          auVar50 = vmaxps_avx(*(undefined1 (*) [16])*pauVar27,ZEXT816(0));
          auVar22 = vminps_avx(*(undefined1 (*) [16])*pauVar27,ZEXT816(0));
          auVar50 = vfmadd213ps_fma(auVar22,auVar51,auVar50);
          *(undefined1 (*) [16])*pauVar27 = auVar50;
          pauVar27 = (undefined1 (*) [64])(*pauVar27 + 0x10);
          uVar28 = uVar38 + 7;
          uVar38 = uVar38 + 4;
        }
        if ((int)uVar38 < (int)uVar31) {
          auVar45 = vpbroadcastq_avx512f();
          auVar46 = vbroadcastss_avx512f(auVar48);
          uVar39 = 0;
          do {
            auVar47 = vpbroadcastq_avx512f();
            auVar43 = vporq_avx512f(auVar47,auVar41);
            auVar47 = vporq_avx512f(auVar47,auVar42);
            uVar23 = vpcmpuq_avx512f(auVar47,auVar45,2);
            uVar24 = vpcmpuq_avx512f(auVar43,auVar45,2);
            bVar15 = (byte)uVar24;
            uVar40 = CONCAT11(bVar15,(byte)uVar23);
            piVar1 = (int *)(*pauVar27 + uVar39 * 4);
            auVar47._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * piVar1[1];
            auVar47._0_4_ = (uint)((byte)uVar23 & 1) * *piVar1;
            auVar47._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * piVar1[2];
            auVar47._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * piVar1[3];
            auVar47._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * piVar1[4];
            auVar47._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * piVar1[5];
            auVar47._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * piVar1[6];
            auVar47._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * piVar1[7];
            auVar47._32_4_ = (uint)(bVar15 & 1) * piVar1[8];
            auVar47._36_4_ = (uint)(bVar15 >> 1 & 1) * piVar1[9];
            auVar47._40_4_ = (uint)(bVar15 >> 2 & 1) * piVar1[10];
            auVar47._44_4_ = (uint)(bVar15 >> 3 & 1) * piVar1[0xb];
            auVar47._48_4_ = (uint)(bVar15 >> 4 & 1) * piVar1[0xc];
            auVar47._52_4_ = (uint)(bVar15 >> 5 & 1) * piVar1[0xd];
            auVar47._56_4_ = (uint)(bVar15 >> 6 & 1) * piVar1[0xe];
            auVar47._60_4_ = (uint)(bVar15 >> 7) * piVar1[0xf];
            uVar23 = vcmpps_avx512f(auVar47,auVar44,1);
            uVar40 = uVar40 & (ushort)uVar23;
            auVar47 = vmulps_avx512f(auVar47,auVar46);
            puVar5 = (uint *)(*pauVar27 + uVar39 * 4);
            bVar7 = (bool)((byte)uVar40 & 1);
            bVar8 = (bool)((byte)(uVar40 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar40 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar40 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar40 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar40 >> 6) & 1);
            bVar14 = (bool)((byte)(uVar40 >> 7) & 1);
            bVar15 = (byte)(uVar40 >> 8);
            bVar16 = (bool)(bVar15 >> 1 & 1);
            bVar17 = (bool)(bVar15 >> 2 & 1);
            bVar18 = (bool)(bVar15 >> 3 & 1);
            bVar19 = (bool)(bVar15 >> 4 & 1);
            bVar20 = (bool)(bVar15 >> 5 & 1);
            bVar21 = (bool)(bVar15 >> 6 & 1);
            *puVar5 = (uint)bVar7 * auVar47._0_4_ | (uint)!bVar7 * *puVar5;
            puVar5[1] = (uint)bVar8 * auVar47._4_4_ | (uint)!bVar8 * puVar5[1];
            puVar5[2] = (uint)bVar9 * auVar47._8_4_ | (uint)!bVar9 * puVar5[2];
            puVar5[3] = (uint)bVar10 * auVar47._12_4_ | (uint)!bVar10 * puVar5[3];
            puVar5[4] = (uint)bVar11 * auVar47._16_4_ | (uint)!bVar11 * puVar5[4];
            puVar5[5] = (uint)bVar12 * auVar47._20_4_ | (uint)!bVar12 * puVar5[5];
            puVar5[6] = (uint)bVar13 * auVar47._24_4_ | (uint)!bVar13 * puVar5[6];
            puVar5[7] = (uint)bVar14 * auVar47._28_4_ | (uint)!bVar14 * puVar5[7];
            puVar5[8] = (uint)(bVar15 & 1) * auVar47._32_4_ | (uint)!(bool)(bVar15 & 1) * puVar5[8];
            puVar5[9] = (uint)bVar16 * auVar47._36_4_ | (uint)!bVar16 * puVar5[9];
            puVar5[10] = (uint)bVar17 * auVar47._40_4_ | (uint)!bVar17 * puVar5[10];
            puVar5[0xb] = (uint)bVar18 * auVar47._44_4_ | (uint)!bVar18 * puVar5[0xb];
            puVar5[0xc] = (uint)bVar19 * auVar47._48_4_ | (uint)!bVar19 * puVar5[0xc];
            puVar5[0xd] = (uint)bVar20 * auVar47._52_4_ | (uint)!bVar20 * puVar5[0xd];
            puVar5[0xe] = (uint)bVar21 * auVar47._56_4_ | (uint)!bVar21 * puVar5[0xe];
            puVar5[0xf] = (uint)(bVar15 >> 7) * auVar47._60_4_ |
                          (uint)!(bool)(bVar15 >> 7) * puVar5[0xf];
            uVar39 = uVar39 + 0x10;
          } while (((ulong)(~uVar38 + uVar31) + 0x10 & 0x1fffffff0) != uVar39);
        }
        uVar34 = uVar34 + 1;
      } while (uVar34 != uVar26);
    }
  }
  else if (iVar29 == 2) {
    if (0 < (int)uVar31) {
      uVar26 = iVar35 * iVar25;
      pp_Var3 = this->_vptr_PReLU_x86_avx512;
      uVar34 = 0;
      auVar44 = ZEXT864(0);
      auVar41 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar42 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        puVar6 = *(undefined4 **)(&this->field_0xd8 + (long)pp_Var3[-3]);
        if (*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) < 2) {
          uVar2 = *puVar6;
          auVar50._4_4_ = uVar2;
          auVar50._0_4_ = uVar2;
          auVar50._8_4_ = uVar2;
          auVar50._12_4_ = uVar2;
          auVar51 = auVar50;
LAB_0033700b:
          auVar45 = ZEXT3264(CONCAT1616(auVar50,auVar50));
LAB_00337011:
          auVar48 = auVar51;
          auVar52 = auVar45._0_32_;
          auVar45 = vinsertf64x4_avx512f(auVar45,auVar52,1);
        }
        else {
          uVar38 = puVar6[uVar34];
          auVar48 = ZEXT416(uVar38);
          if (iVar25 == 4) {
            auVar50 = *(undefined1 (*) [16])(puVar6 + uVar34 * 4);
            auVar51 = ZEXT416(uVar38);
            goto LAB_0033700b;
          }
          auVar50._4_4_ = uVar38;
          auVar50._0_4_ = uVar38;
          auVar50._8_4_ = uVar38;
          auVar50._12_4_ = uVar38;
          auVar51 = ZEXT416(uVar38);
          if (iVar25 == 8) {
            auVar45 = ZEXT3264(*(undefined1 (*) [32])(puVar6 + uVar34 * 8));
            goto LAB_00337011;
          }
          auVar52._4_4_ = uVar38;
          auVar52._0_4_ = uVar38;
          auVar52._8_4_ = uVar38;
          auVar52._12_4_ = uVar38;
          auVar52._16_4_ = uVar38;
          auVar52._20_4_ = uVar38;
          auVar52._24_4_ = uVar38;
          auVar52._28_4_ = uVar38;
          auVar45 = ZEXT3264(auVar52);
          if (iVar25 != 0x10) goto LAB_00337011;
          auVar45 = *(undefined1 (*) [64])(puVar6 + uVar34 * 0x10);
        }
        pauVar27 = (undefined1 (*) [64])
                   ((long)bottom_top_blob->w * uVar34 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        uVar38 = 0;
        if (0xf < (int)uVar26) {
          iVar29 = 0xf;
          do {
            auVar46 = vmaxps_avx512f(*pauVar27,auVar44);
            auVar47 = vminps_avx512f(*pauVar27,auVar44);
            auVar46 = vfmadd213ps_avx512f(auVar47,auVar45,auVar46);
            *pauVar27 = auVar46;
            pauVar27 = pauVar27 + 1;
            iVar29 = iVar29 + 0x10;
            uVar38 = uVar26 & 0xfffffff0;
          } while (iVar29 < (int)uVar26);
        }
        uVar28 = uVar38 | 7;
        while ((int)uVar28 < (int)uVar26) {
          auVar53 = vmaxps_avx(*(undefined1 (*) [32])*pauVar27,ZEXT832(0));
          auVar49 = vminps_avx(*(undefined1 (*) [32])*pauVar27,ZEXT832(0));
          auVar51 = vfmadd213ps_fma(auVar49,auVar52,auVar53);
          *(undefined1 (*) [32])*pauVar27 = ZEXT1632(auVar51);
          pauVar27 = (undefined1 (*) [64])(*pauVar27 + 0x20);
          uVar28 = uVar38 + 0xf;
          uVar38 = uVar38 + 8;
        }
        uVar28 = uVar38 | 3;
        while ((int)uVar28 < (int)uVar26) {
          auVar51 = vmaxps_avx(*(undefined1 (*) [16])*pauVar27,ZEXT816(0));
          auVar22 = vminps_avx(*(undefined1 (*) [16])*pauVar27,ZEXT816(0));
          auVar51 = vfmadd213ps_fma(auVar22,auVar50,auVar51);
          *(undefined1 (*) [16])*pauVar27 = auVar51;
          pauVar27 = (undefined1 (*) [64])(*pauVar27 + 0x10);
          uVar28 = uVar38 + 7;
          uVar38 = uVar38 + 4;
        }
        if ((int)uVar38 < (int)uVar26) {
          auVar45 = vpbroadcastq_avx512f();
          auVar46 = vbroadcastss_avx512f(auVar48);
          uVar39 = 0;
          do {
            auVar47 = vpbroadcastq_avx512f();
            auVar43 = vporq_avx512f(auVar47,auVar41);
            auVar47 = vporq_avx512f(auVar47,auVar42);
            uVar23 = vpcmpuq_avx512f(auVar47,auVar45,2);
            uVar24 = vpcmpuq_avx512f(auVar43,auVar45,2);
            bVar15 = (byte)uVar24;
            uVar40 = CONCAT11(bVar15,(byte)uVar23);
            piVar1 = (int *)(*pauVar27 + uVar39 * 4);
            auVar43._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * piVar1[1];
            auVar43._0_4_ = (uint)((byte)uVar23 & 1) * *piVar1;
            auVar43._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * piVar1[2];
            auVar43._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * piVar1[3];
            auVar43._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * piVar1[4];
            auVar43._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * piVar1[5];
            auVar43._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * piVar1[6];
            auVar43._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * piVar1[7];
            auVar43._32_4_ = (uint)(bVar15 & 1) * piVar1[8];
            auVar43._36_4_ = (uint)(bVar15 >> 1 & 1) * piVar1[9];
            auVar43._40_4_ = (uint)(bVar15 >> 2 & 1) * piVar1[10];
            auVar43._44_4_ = (uint)(bVar15 >> 3 & 1) * piVar1[0xb];
            auVar43._48_4_ = (uint)(bVar15 >> 4 & 1) * piVar1[0xc];
            auVar43._52_4_ = (uint)(bVar15 >> 5 & 1) * piVar1[0xd];
            auVar43._56_4_ = (uint)(bVar15 >> 6 & 1) * piVar1[0xe];
            auVar43._60_4_ = (uint)(bVar15 >> 7) * piVar1[0xf];
            uVar23 = vcmpps_avx512f(auVar43,auVar44,1);
            uVar40 = uVar40 & (ushort)uVar23;
            auVar47 = vmulps_avx512f(auVar43,auVar46);
            puVar5 = (uint *)(*pauVar27 + uVar39 * 4);
            bVar7 = (bool)((byte)uVar40 & 1);
            bVar8 = (bool)((byte)(uVar40 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar40 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar40 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar40 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar40 >> 6) & 1);
            bVar14 = (bool)((byte)(uVar40 >> 7) & 1);
            bVar15 = (byte)(uVar40 >> 8);
            bVar16 = (bool)(bVar15 >> 1 & 1);
            bVar17 = (bool)(bVar15 >> 2 & 1);
            bVar18 = (bool)(bVar15 >> 3 & 1);
            bVar19 = (bool)(bVar15 >> 4 & 1);
            bVar20 = (bool)(bVar15 >> 5 & 1);
            bVar21 = (bool)(bVar15 >> 6 & 1);
            *puVar5 = (uint)bVar7 * auVar47._0_4_ | (uint)!bVar7 * *puVar5;
            puVar5[1] = (uint)bVar8 * auVar47._4_4_ | (uint)!bVar8 * puVar5[1];
            puVar5[2] = (uint)bVar9 * auVar47._8_4_ | (uint)!bVar9 * puVar5[2];
            puVar5[3] = (uint)bVar10 * auVar47._12_4_ | (uint)!bVar10 * puVar5[3];
            puVar5[4] = (uint)bVar11 * auVar47._16_4_ | (uint)!bVar11 * puVar5[4];
            puVar5[5] = (uint)bVar12 * auVar47._20_4_ | (uint)!bVar12 * puVar5[5];
            puVar5[6] = (uint)bVar13 * auVar47._24_4_ | (uint)!bVar13 * puVar5[6];
            puVar5[7] = (uint)bVar14 * auVar47._28_4_ | (uint)!bVar14 * puVar5[7];
            puVar5[8] = (uint)(bVar15 & 1) * auVar47._32_4_ | (uint)!(bool)(bVar15 & 1) * puVar5[8];
            puVar5[9] = (uint)bVar16 * auVar47._36_4_ | (uint)!bVar16 * puVar5[9];
            puVar5[10] = (uint)bVar17 * auVar47._40_4_ | (uint)!bVar17 * puVar5[10];
            puVar5[0xb] = (uint)bVar18 * auVar47._44_4_ | (uint)!bVar18 * puVar5[0xb];
            puVar5[0xc] = (uint)bVar19 * auVar47._48_4_ | (uint)!bVar19 * puVar5[0xc];
            puVar5[0xd] = (uint)bVar20 * auVar47._52_4_ | (uint)!bVar20 * puVar5[0xd];
            puVar5[0xe] = (uint)bVar21 * auVar47._56_4_ | (uint)!bVar21 * puVar5[0xe];
            puVar5[0xf] = (uint)(bVar15 >> 7) * auVar47._60_4_ |
                          (uint)!(bool)(bVar15 >> 7) * puVar5[0xf];
            uVar39 = uVar39 + 0x10;
          } while (((ulong)(~uVar38 + uVar26) + 0x10 & 0x1fffffff0) != uVar39);
        }
        uVar34 = uVar34 + 1;
      } while (uVar34 != uVar31);
    }
  }
  else if (iVar29 == 1) {
    iVar25 = iVar25 * iVar35;
    pp_Var3 = this->_vptr_PReLU_x86_avx512;
    p_Var4 = pp_Var3[-3];
    pauVar27 = (undefined1 (*) [64])bottom_top_blob->data;
    puVar5 = *(uint **)(&this->field_0xd8 + (long)p_Var4);
    if (*(int *)(&this->field_0xd0 + (long)p_Var4) < 2) {
      uVar31 = *puVar5;
      iVar29 = iVar25 + 0xf;
      if (-1 < iVar25) {
        iVar29 = iVar25;
      }
      uVar26 = iVar29 >> 4;
      if (0xf < iVar25) {
        auVar41 = vbroadcastss_avx512f(ZEXT416(uVar31));
        uVar34 = (ulong)uVar26;
        pauVar30 = pauVar27;
        do {
          auVar42 = vmaxps_avx512f(*pauVar30,ZEXT864(0));
          auVar44 = vminps_avx512f(*pauVar30,ZEXT864(0));
          auVar42 = vfmadd213ps_avx512f(auVar44,auVar41,auVar42);
          *pauVar30 = auVar42;
          pauVar30 = pauVar30 + 1;
          uVar34 = uVar34 - 1;
        } while (uVar34 != 0);
      }
      iVar35 = iVar25 + uVar26 * -0x10;
      iVar29 = iVar35 + 7;
      if (-1 < iVar35) {
        iVar29 = iVar35;
      }
      if (7 < iVar35) {
        auVar49._4_4_ = uVar31;
        auVar49._0_4_ = uVar31;
        auVar49._8_4_ = uVar31;
        auVar49._12_4_ = uVar31;
        auVar49._16_4_ = uVar31;
        auVar49._20_4_ = uVar31;
        auVar49._24_4_ = uVar31;
        auVar49._28_4_ = uVar31;
        uVar34 = (ulong)(uint)(iVar29 >> 3);
        pauVar32 = (undefined1 (*) [32])(*pauVar27 + (long)(int)(uVar26 * 0x10) * 4);
        do {
          auVar53 = vmaxps_avx(*pauVar32,ZEXT1632(ZEXT816(0) << 0x40));
          auVar52 = vminps_avx(*pauVar32,ZEXT1632(ZEXT816(0) << 0x40));
          auVar51 = vfmadd213ps_fma(auVar52,auVar49,auVar53);
          *pauVar32 = ZEXT1632(auVar51);
          pauVar32 = pauVar32 + 1;
          uVar34 = uVar34 - 1;
        } while (uVar34 != 0);
      }
      iVar29 = uVar26 * 0x10 + (iVar29 >> 3) * 8;
      iVar36 = iVar25 - iVar29;
      iVar35 = iVar36 + 3;
      if (-1 < iVar36) {
        iVar35 = iVar36;
      }
      if (3 < iVar36) {
        auVar48._4_4_ = uVar31;
        auVar48._0_4_ = uVar31;
        auVar48._8_4_ = uVar31;
        auVar48._12_4_ = uVar31;
        uVar34 = (ulong)(uint)(iVar35 >> 2);
        pauVar33 = (undefined1 (*) [16])(*pauVar27 + (long)iVar29 * 4);
        do {
          auVar51 = vmaxps_avx(*pauVar33,ZEXT816(0) << 0x40);
          auVar50 = vminps_avx(*pauVar33,ZEXT816(0) << 0x40);
          auVar51 = vfmadd213ps_fma(auVar50,auVar48,auVar51);
          *pauVar33 = auVar51;
          pauVar33 = pauVar33 + 1;
          uVar34 = uVar34 - 1;
        } while (uVar34 != 0);
      }
      iVar29 = iVar29 + (iVar35 >> 2) * 4;
      if (iVar29 < iVar25) {
        lVar37 = (long)iVar29;
        auVar41 = vpbroadcastq_avx512f();
        auVar42 = vbroadcastss_avx512f(ZEXT416(uVar31));
        uVar34 = 0;
        auVar44 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar45 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar46 = vpbroadcastq_avx512f();
          auVar47 = vporq_avx512f(auVar46,auVar44);
          auVar46 = vporq_avx512f(auVar46,auVar45);
          uVar23 = vpcmpuq_avx512f(auVar46,auVar41,2);
          uVar24 = vpcmpuq_avx512f(auVar47,auVar41,2);
          bVar15 = (byte)uVar24;
          uVar40 = CONCAT11(bVar15,(byte)uVar23);
          piVar1 = (int *)(*pauVar27 + uVar34 * 4 + lVar37 * 4);
          auVar46._4_4_ = (uint)((byte)(uVar40 >> 1) & 1) * piVar1[1];
          auVar46._0_4_ = (uint)((byte)uVar23 & 1) * *piVar1;
          auVar46._8_4_ = (uint)((byte)(uVar40 >> 2) & 1) * piVar1[2];
          auVar46._12_4_ = (uint)((byte)(uVar40 >> 3) & 1) * piVar1[3];
          auVar46._16_4_ = (uint)((byte)(uVar40 >> 4) & 1) * piVar1[4];
          auVar46._20_4_ = (uint)((byte)(uVar40 >> 5) & 1) * piVar1[5];
          auVar46._24_4_ = (uint)((byte)(uVar40 >> 6) & 1) * piVar1[6];
          auVar46._28_4_ = (uint)((byte)(uVar40 >> 7) & 1) * piVar1[7];
          auVar46._32_4_ = (uint)(bVar15 & 1) * piVar1[8];
          auVar46._36_4_ = (uint)(bVar15 >> 1 & 1) * piVar1[9];
          auVar46._40_4_ = (uint)(bVar15 >> 2 & 1) * piVar1[10];
          auVar46._44_4_ = (uint)(bVar15 >> 3 & 1) * piVar1[0xb];
          auVar46._48_4_ = (uint)(bVar15 >> 4 & 1) * piVar1[0xc];
          auVar46._52_4_ = (uint)(bVar15 >> 5 & 1) * piVar1[0xd];
          auVar46._56_4_ = (uint)(bVar15 >> 6 & 1) * piVar1[0xe];
          auVar46._60_4_ = (uint)(bVar15 >> 7) * piVar1[0xf];
          uVar23 = vcmpps_avx512f(auVar46,ZEXT1664(ZEXT816(0) << 0x40),1);
          uVar40 = uVar40 & (ushort)uVar23;
          auVar46 = vmulps_avx512f(auVar46,auVar42);
          puVar5 = (uint *)(*pauVar27 + uVar34 * 4 + lVar37 * 4);
          bVar7 = (bool)((byte)uVar40 & 1);
          bVar8 = (bool)((byte)(uVar40 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar40 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar40 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar40 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar40 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar40 >> 6) & 1);
          bVar14 = (bool)((byte)(uVar40 >> 7) & 1);
          bVar15 = (byte)(uVar40 >> 8);
          bVar16 = (bool)(bVar15 >> 1 & 1);
          bVar17 = (bool)(bVar15 >> 2 & 1);
          bVar18 = (bool)(bVar15 >> 3 & 1);
          bVar19 = (bool)(bVar15 >> 4 & 1);
          bVar20 = (bool)(bVar15 >> 5 & 1);
          bVar21 = (bool)(bVar15 >> 6 & 1);
          *puVar5 = (uint)bVar7 * auVar46._0_4_ | (uint)!bVar7 * *puVar5;
          puVar5[1] = (uint)bVar8 * auVar46._4_4_ | (uint)!bVar8 * puVar5[1];
          puVar5[2] = (uint)bVar9 * auVar46._8_4_ | (uint)!bVar9 * puVar5[2];
          puVar5[3] = (uint)bVar10 * auVar46._12_4_ | (uint)!bVar10 * puVar5[3];
          puVar5[4] = (uint)bVar11 * auVar46._16_4_ | (uint)!bVar11 * puVar5[4];
          puVar5[5] = (uint)bVar12 * auVar46._20_4_ | (uint)!bVar12 * puVar5[5];
          puVar5[6] = (uint)bVar13 * auVar46._24_4_ | (uint)!bVar13 * puVar5[6];
          puVar5[7] = (uint)bVar14 * auVar46._28_4_ | (uint)!bVar14 * puVar5[7];
          puVar5[8] = (uint)(bVar15 & 1) * auVar46._32_4_ | (uint)!(bool)(bVar15 & 1) * puVar5[8];
          puVar5[9] = (uint)bVar16 * auVar46._36_4_ | (uint)!bVar16 * puVar5[9];
          puVar5[10] = (uint)bVar17 * auVar46._40_4_ | (uint)!bVar17 * puVar5[10];
          puVar5[0xb] = (uint)bVar18 * auVar46._44_4_ | (uint)!bVar18 * puVar5[0xb];
          puVar5[0xc] = (uint)bVar19 * auVar46._48_4_ | (uint)!bVar19 * puVar5[0xc];
          puVar5[0xd] = (uint)bVar20 * auVar46._52_4_ | (uint)!bVar20 * puVar5[0xd];
          puVar5[0xe] = (uint)bVar21 * auVar46._56_4_ | (uint)!bVar21 * puVar5[0xe];
          puVar5[0xf] = (uint)(bVar15 >> 7) * auVar46._60_4_ |
                        (uint)!(bool)(bVar15 >> 7) * puVar5[0xf];
          uVar34 = uVar34 + 0x10;
        } while (((iVar25 - lVar37) + 0xfU & 0xfffffffffffffff0) != uVar34);
      }
    }
    else {
      iVar29 = iVar25 + 0xf;
      if (-1 < iVar25) {
        iVar29 = iVar25;
      }
      uVar31 = iVar29 >> 4;
      if (0xf < iVar25) {
        uVar34 = (ulong)uVar31;
        lVar37 = 0;
        do {
          auVar41 = vmaxps_avx512f(*(undefined1 (*) [64])(*pauVar27 + lVar37),ZEXT864(0));
          auVar42 = vminps_avx512f(*(undefined1 (*) [64])(*pauVar27 + lVar37),ZEXT864(0));
          auVar41 = vfmadd132ps_avx512f(auVar42,auVar41,
                                        *(undefined1 (*) [64])((long)puVar5 + lVar37));
          *(undefined1 (*) [64])(*pauVar27 + lVar37) = auVar41;
          lVar37 = lVar37 + 0x40;
          uVar34 = uVar34 - 1;
        } while (uVar34 != 0);
      }
      iVar35 = iVar25 + uVar31 * -0x10;
      iVar29 = iVar35 + 7;
      if (-1 < iVar35) {
        iVar29 = iVar35;
      }
      if (7 < iVar35) {
        uVar34 = (ulong)(uint)(iVar29 >> 3);
        lVar37 = (long)(int)(uVar31 * 0x10) << 2;
        do {
          auVar53 = vmaxps_avx(*(undefined1 (*) [32])(*pauVar27 + lVar37),
                               ZEXT1632(ZEXT816(0) << 0x40));
          auVar52 = vminps_avx(*(undefined1 (*) [32])(*pauVar27 + lVar37),
                               ZEXT1632(ZEXT816(0) << 0x40));
          auVar51 = vfmadd132ps_fma(auVar52,auVar53,*(undefined1 (*) [32])((long)puVar5 + lVar37));
          *(undefined1 (*) [32])(*pauVar27 + lVar37) = ZEXT1632(auVar51);
          lVar37 = lVar37 + 0x20;
          uVar34 = uVar34 - 1;
        } while (uVar34 != 0);
      }
      iVar29 = uVar31 * 0x10 + (iVar29 >> 3) * 8;
      iVar36 = iVar25 - iVar29;
      iVar35 = iVar36 + 3;
      if (-1 < iVar36) {
        iVar35 = iVar36;
      }
      if (3 < iVar36) {
        uVar34 = (ulong)(uint)(iVar35 >> 2);
        lVar37 = (long)iVar29 << 2;
        do {
          auVar51 = vmaxps_avx(*(undefined1 (*) [16])(*pauVar27 + lVar37),ZEXT816(0) << 0x40);
          auVar50 = vminps_avx(*(undefined1 (*) [16])(*pauVar27 + lVar37),ZEXT816(0) << 0x40);
          auVar51 = vfmadd132ps_fma(auVar50,auVar51,*(undefined1 (*) [16])((long)puVar5 + lVar37));
          *(undefined1 (*) [16])(*pauVar27 + lVar37) = auVar51;
          lVar37 = lVar37 + 0x10;
          uVar34 = uVar34 - 1;
        } while (uVar34 != 0);
      }
      iVar29 = iVar29 + (iVar35 >> 2) * 4;
      if (iVar29 < iVar25) {
        lVar37 = (long)iVar29;
        do {
          if (*(float *)(*pauVar27 + lVar37 * 4) < 0.0) {
            *(float *)(*pauVar27 + lVar37 * 4) =
                 *(float *)(*pauVar27 + lVar37 * 4) *
                 *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var3[-3]) + lVar37 * 4);
          }
          lVar37 = lVar37 + 1;
        } while (lVar37 < iVar25);
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_load_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}